

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O2

bool __thiscall
UnifiedRegex::StandardChars<char16_t>::ToEquivs
          (StandardChars<char16_t> *this,MappingSource mappingSource,Char c,Char *equivs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined7 in_register_00000031;
  
  iVar4 = (int)CONCAT71(in_register_00000031,mappingSource);
  if (iVar4 != 1) {
    if (iVar4 == 0) {
      bVar2 = CaseMapper<UnifiedRegex::TrivialCaseMapper>::ToEquivs
                        (&this->unicodeDataCaseMapper,c,equivs);
      return bVar2;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/StandardChars.h"
                       ,0x166,"(mappingSource == CaseInsensitive::MappingSource::CaseFolding)",
                       "mappingSource == CaseInsensitive::MappingSource::CaseFolding");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToEquivs
                    (&this->caseFoldingCaseMapper,c,equivs);
  return bVar2;
}

Assistant:

inline bool ToEquivs(CaseInsensitive::MappingSource mappingSource, Char c, __out_ecount(4) Char* equivs) const
        {
            if (mappingSource == CaseInsensitive::MappingSource::UnicodeData)
            {
                return unicodeDataCaseMapper.ToEquivs(c, equivs);
            }
            else
            {
                Assert(mappingSource == CaseInsensitive::MappingSource::CaseFolding);
                return caseFoldingCaseMapper.ToEquivs(c, equivs);
            }
        }